

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::LoadConstantLayerParams::MergeFrom
          (LoadConstantLayerParams *this,LoadConstantLayerParams *from)

{
  int iVar1;
  void *pvVar2;
  LogMessage *pLVar3;
  WeightParams *pWVar4;
  LogFinisher local_89;
  LogMessage local_88;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O1/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x97c3);
    pLVar3 = google::protobuf::internal::LogMessage::operator<<
                       (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_88,pLVar3);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_88,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4b6);
    pLVar3 = google::protobuf::internal::LogMessage::operator<<
                       (&local_88,"CHECK failed: (&other) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_89,pLVar3);
    google::protobuf::internal::LogMessage::~LogMessage(&local_88);
  }
  iVar1 = (from->shape_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve
              (&this->shape_,iVar1 + (this->shape_).current_size_);
    memcpy(((this->shape_).rep_)->elements + (this->shape_).current_size_,
           ((from->shape_).rep_)->elements,(long)(from->shape_).current_size_ << 3);
    (this->shape_).current_size_ = (this->shape_).current_size_ + (from->shape_).current_size_;
  }
  if ((from != (LoadConstantLayerParams *)&_LoadConstantLayerParams_default_instance_) &&
     (from->data_ != (WeightParams *)0x0)) {
    if (this->data_ == (WeightParams *)0x0) {
      pWVar4 = (WeightParams *)operator_new(0x50);
      WeightParams::WeightParams(pWVar4);
      this->data_ = pWVar4;
    }
    pWVar4 = from->data_;
    if (pWVar4 == (WeightParams *)0x0) {
      pWVar4 = (WeightParams *)&_WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(this->data_,pWVar4);
  }
  return;
}

Assistant:

void LoadConstantLayerParams::MergeFrom(const LoadConstantLayerParams& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.LoadConstantLayerParams)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  shape_.MergeFrom(from.shape_);
  if (from.has_data()) {
    mutable_data()->::CoreML::Specification::WeightParams::MergeFrom(from.data());
  }
}